

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

int mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::copy_attr
              (MPI_Datatype param_1,int param_2,void *param_3,void *attribute_val_in,
              void *attribute_val_out,int *flag)

{
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *this;
  
  this = (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)operator_new(0x20);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function
            (this,(function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)attribute_val_in);
  *(function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> **)attribute_val_out = this;
  *flag = 1;
  return 0;
}

Assistant:

static int copy_attr(MPI_Datatype, int, void*, void *attribute_val_in, void *attribute_val_out, int *flag) {
        T** out = (T**) attribute_val_out;
        // copy via copy constructor
        *out = new T(*(T*)(attribute_val_in));
        *flag = 1;
        return MPI_SUCCESS;
    }